

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QFont>_>::findOrInsert<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QFont>_> *this,QByteArray *key)

{
  bool bVar1;
  size_t in_RDX;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *in_RSI;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *in_RDI;
  long in_FS_OFFSET;
  Bucket BVar2;
  iterator iVar3;
  size_t hash;
  Bucket it;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *this_00;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *key_00;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *in_stack_ffffffffffffffc8;
  undefined1 *local_30;
  Span *local_28;
  undefined1 *local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  key_00 = in_RSI;
  Bucket::Bucket(&local_18,(Span *)0x0,0);
  calculateHash<QByteArray>((QByteArray *)this_00,(size_t)in_RDI);
  if (in_RSI->numBuckets != 0) {
    BVar2 = findBucketWithHash<QByteArray>(in_stack_ffffffffffffffc8,(QByteArray *)key_00,in_RDX);
    local_28 = BVar2.span;
    local_18.span = local_28;
    local_20 = (undefined1 *)BVar2.index;
    local_18.index = (size_t)local_20;
    bVar1 = Bucket::isUnused((Bucket *)0x2df78f);
    if (!bVar1) {
      iVar3 = Bucket::toIterator((Bucket *)this_00,in_RDI);
      *(iterator *)in_RDI = iVar3;
      *(undefined1 *)&in_RDI->numBuckets = 1;
      goto LAB_002df846;
    }
  }
  bVar1 = shouldGrow(in_RSI);
  if (bVar1) {
    rehash(this,(size_t)key);
    BVar2 = findBucketWithHash<QByteArray>(in_stack_ffffffffffffffc8,(QByteArray *)key_00,in_RDX);
    local_18.span = BVar2.span;
    local_30 = (undefined1 *)BVar2.index;
    local_18.index = (size_t)local_30;
  }
  Bucket::insert((Bucket *)0x2df819);
  in_RSI->size = in_RSI->size + 1;
  iVar3 = Bucket::toIterator((Bucket *)this_00,in_RDI);
  *(iterator *)in_RDI = iVar3;
  *(undefined1 *)&in_RDI->numBuckets = 0;
LAB_002df846:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (InsertionResult *)this_00;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }